

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O1

int str_format(lua_State *L)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  size_t l_00;
  byte *pbVar9;
  bool bVar10;
  lua_Number lVar11;
  char form [18];
  size_t l;
  size_t sfl;
  char buff [512];
  luaL_Buffer b;
  undefined4 local_228c;
  char local_2288 [28];
  int local_226c;
  char *local_2268;
  byte *local_2260;
  ulong local_2258;
  size_t local_2250;
  size_t local_2248 [64];
  luaL_Buffer local_2048;
  
  pbVar3 = (byte *)luaL_checklstring(L,1,&local_2250);
  luaL_buffinit(L,&local_2048);
  if (0 < (long)local_2250) {
    pbVar9 = pbVar3 + local_2250;
    local_228c = 1;
    local_2260 = pbVar9;
    do {
      if (*pbVar3 != 0x25) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          luaL_prepbuffer(&local_2048);
        }
        bVar2 = *pbVar3;
        pbVar3 = pbVar3 + 1;
LAB_001129f7:
        *local_2048.p = bVar2;
        local_2048.p = local_2048.p + 1;
        goto LAB_00112c1b;
      }
      if (pbVar3[1] == 0x25) {
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          luaL_prepbuffer(&local_2048);
        }
        bVar2 = pbVar3[1];
        pbVar3 = pbVar3 + 2;
        goto LAB_001129f7;
      }
      pbVar3 = pbVar3 + 1;
      bVar2 = *pbVar3;
      pbVar9 = pbVar3;
      while ((bVar2 != 0 && (pvVar4 = memchr("-+ #0",(int)(char)bVar2,6), pvVar4 != (void *)0x0))) {
        bVar2 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
      }
      if (5 < (ulong)((long)pbVar9 - (long)pbVar3)) {
        luaL_error(L,"invalid format (repeated flags)");
      }
      uVar8 = (ulong)(*pbVar9 - 0x30 < 10);
      pbVar9 = pbVar9 + (pbVar9[uVar8] - 0x30 < 10) + uVar8;
      if (*pbVar9 == 0x2e) {
        pbVar7 = pbVar9 + 2;
        if (9 < pbVar9[1] - 0x30) {
          pbVar7 = pbVar9 + 1;
        }
        pbVar9 = pbVar7 + (pbVar9[(ulong)(pbVar9[1] - 0x30 < 10) + 1] - 0x30 < 10);
      }
      if (*pbVar9 - 0x30 < 10) {
        luaL_error(L,"invalid format (width or precision too long)");
      }
      local_228c = local_228c + 1;
      local_2288[0] = '%';
      strncpy(local_2288 + 1,(char *)pbVar3,(size_t)(pbVar9 + (1 - (long)pbVar3)));
      pbVar9[(long)(local_2288 + (2 - (long)pbVar3))] = 0;
      bVar2 = *pbVar9;
      if (bVar2 < 99) {
        if ((bVar2 != 0x45) && (bVar2 != 0x47)) {
          if (bVar2 == 0x58) goto switchD_00112b1e_caseD_6f;
          goto switchD_00112b1e_caseD_68;
        }
switchD_00112b1e_caseD_65:
        luaL_checknumber(L,local_228c);
        sprintf((char *)local_2248,local_2288);
        goto LAB_00112bf0;
      }
      switch(bVar2) {
      case 99:
        lVar11 = luaL_checknumber(L,local_228c);
        sprintf((char *)local_2248,local_2288,(ulong)(uint)(int)lVar11);
        goto LAB_00112bf0;
      case 100:
      case 0x69:
        sVar5 = strlen(local_2288);
        cVar1 = local_2288[sVar5 - 1];
        (local_2288 + (sVar5 - 1))[0] = 'l';
        (local_2288 + (sVar5 - 1))[1] = '\0';
        local_2288[sVar5] = cVar1;
        local_2288[sVar5 + 1] = '\0';
        lVar11 = luaL_checknumber(L,local_228c);
        uVar8 = (ulong)lVar11;
        goto LAB_00112bbb;
      case 0x65:
      case 0x66:
      case 0x67:
        goto switchD_00112b1e_caseD_65;
      default:
switchD_00112b1e_caseD_68:
        local_226c = luaL_error(L,"invalid option \'%%%c\' to \'format\'",
                                (ulong)(uint)(int)(char)bVar2);
        bVar10 = true;
        break;
      case 0x6f:
      case 0x75:
      case 0x78:
switchD_00112b1e_caseD_6f:
        sVar5 = strlen(local_2288);
        cVar1 = local_2288[sVar5 - 1];
        (local_2288 + (sVar5 - 1))[0] = 'l';
        (local_2288 + (sVar5 - 1))[1] = '\0';
        local_2288[sVar5] = cVar1;
        local_2288[sVar5 + 1] = '\0';
        lVar11 = luaL_checknumber(L,local_228c);
        uVar8 = (long)(lVar11 - 9.223372036854776e+18) & (long)lVar11 >> 0x3f | (long)lVar11;
LAB_00112bbb:
        sprintf((char *)local_2248,local_2288,uVar8);
LAB_00112bf0:
        sVar5 = strlen((char *)local_2248);
        luaL_addlstring(&local_2048,(char *)local_2248,sVar5);
        bVar10 = false;
        break;
      case 0x71:
        pbVar3 = (byte *)luaL_checklstring(L,local_228c,local_2248);
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          luaL_prepbuffer(&local_2048);
        }
        *local_2048.p = 0x22;
        local_2048.p = local_2048.p + 1;
        while (bVar10 = local_2248[0] != 0, local_2248[0] = local_2248[0] - 1, bVar10) {
          bVar2 = *pbVar3;
          if (bVar2 < 0xd) {
            if (bVar2 == 0) {
              l_00 = 4;
              pcVar6 = "\\000";
              goto LAB_00112da0;
            }
            if (bVar2 == 10) goto LAB_00112d29;
LAB_00112d52:
            if (&stack0xffffffffffffffd0 <= local_2048.p) {
              luaL_prepbuffer(&local_2048);
            }
            *local_2048.p = *pbVar3;
            local_2048.p = local_2048.p + 1;
          }
          else {
            if (bVar2 != 0xd) {
              if ((bVar2 == 0x5c) || (bVar2 == 0x22)) {
LAB_00112d29:
                if (&stack0xffffffffffffffd0 <= local_2048.p) {
                  luaL_prepbuffer(&local_2048);
                }
                *local_2048.p = 0x5c;
                local_2048.p = local_2048.p + 1;
              }
              goto LAB_00112d52;
            }
            l_00 = 2;
            pcVar6 = "\\r";
LAB_00112da0:
            luaL_addlstring(&local_2048,pcVar6,l_00);
          }
          pbVar3 = pbVar3 + 1;
        }
        if (&stack0xffffffffffffffd0 <= local_2048.p) {
          luaL_prepbuffer(&local_2048);
        }
        *local_2048.p = 0x22;
        bVar10 = false;
        local_2048.p = local_2048.p + 1;
        break;
      case 0x73:
        local_2268 = luaL_checklstring(L,local_228c,&local_2258);
        pcVar6 = strchr(local_2288,0x2e);
        if (local_2258 < 100 || pcVar6 != (char *)0x0) {
          sprintf((char *)local_2248,local_2288,local_2268);
          goto LAB_00112bf0;
        }
        lua_pushvalue(L,local_228c);
        luaL_addvalue(&local_2048);
        bVar10 = false;
      }
      if (bVar10) {
        return local_226c;
      }
      pbVar3 = pbVar9 + 1;
      pbVar9 = local_2260;
LAB_00112c1b:
    } while (pbVar3 < pbVar9);
  }
  luaL_pushresult(&local_2048);
  return 1;
}

Assistant:

static int str_format (lua_State *L) {
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format (`%...') */
      char buff[MAX_ITEM];  /* to store the formatted item */
      arg++;
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          sprintf(buff, form, (int)luaL_checknumber(L, arg));
          break;
        }
        case 'd':  case 'i': {
          addintlen(form);
          sprintf(buff, form, (LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'o':  case 'u':  case 'x':  case 'X': {
          addintlen(form);
          sprintf(buff, form, (unsigned LUA_INTFRM_T)luaL_checknumber(L, arg));
          break;
        }
        case 'e':  case 'E': case 'f':
        case 'g': case 'G': {
          sprintf(buff, form, (double)luaL_checknumber(L, arg));
          break;
        }
        case 'q': {
          addquoted(L, &b, arg);
          continue;  /* skip the 'addsize' at the end */
        }
        case 's': {
          size_t l;
          const char *s = luaL_checklstring(L, arg, &l);
          if (!strchr(form, '.') && l >= 100) {
            /* no precision and string is too long to be formatted;
               keep original string */
            lua_pushvalue(L, arg);
            luaL_addvalue(&b);
            continue;  /* skip the `addsize' at the end */
          }
          else {
            sprintf(buff, form, s);
            break;
          }
        }
        default: {  /* also treat cases `pnLlh' */
          return luaL_error(L, "invalid option " LUA_QL("%%%c") " to "
                               LUA_QL("format"), *(strfrmt - 1));
        }
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}